

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docking-data.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vm<value_mask_strategy> *machine)

{
  ostream *poVar1;
  size_type sVar2;
  uint64_t uVar3;
  variant<std::monostate,_update_bitmask,_write_memory> local_40;
  vm<value_mask_strategy> *local_18;
  vm<value_mask_strategy> *machine_local;
  ostream *os_local;
  
  local_18 = machine;
  machine_local = (vm<value_mask_strategy> *)os;
  poVar1 = std::operator<<(os,"VM (mask: ");
  std::variant<std::monostate,update_bitmask,write_memory>::
  variant<update_bitmask_const&,void,void,update_bitmask,void>
            ((variant<std::monostate,update_bitmask,write_memory> *)&local_40,&local_18->mask);
  poVar1 = operator<<(poVar1,(instruction_t *)&local_40);
  poVar1 = std::operator<<(poVar1,", memory: ");
  sVar2 = std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::size(&local_18->mem);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," elements sum to ");
  uVar3 = vm<address_decoder_strategy>::sum((vm<address_decoder_strategy> *)local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  std::operator<<(poVar1,")");
  std::variant<std::monostate,_update_bitmask,_write_memory>::~variant(&local_40);
  return (ostream *)machine_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const vm<S>& machine) {
  os << "VM (mask: " << machine.mask << ", memory: " << machine.mem.size() << " elements sum to " << machine.sum() << ")";
  return os;
}